

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint _c;
  size_t _elemsize;
  Mat *pMVar4;
  pointer pMVar5;
  int *piVar6;
  pointer pMVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  pointer pMVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  bool bVar22;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar5->dims;
  _elemsize = pMVar5->elemsize;
  iVar15 = this->axis;
  if (uVar1 == 1) {
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar12 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,_elemsize,opt->blob_allocator);
    pvVar21 = pMVar4->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      lVar13 = 0;
      uVar19 = 0;
      do {
        sVar16 = (long)*(int *)((long)&pMVar5->w + lVar13) * _elemsize;
        memcpy(pvVar21,*(void **)((long)&pMVar5->data + lVar13),sVar16);
        pvVar21 = (void *)((long)pvVar21 + sVar16);
        uVar19 = uVar19 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x48;
      } while (uVar19 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  iVar15 = (iVar15 >> 0x1f & uVar1) + iVar15;
  if ((uVar1 == 2) && (iVar15 == 0)) {
    iVar12 = pMVar5->w;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar8 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->h;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,iVar8,_elemsize,opt->blob_allocator);
    pvVar21 = pMVar4->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      lVar13 = 0;
      uVar19 = 0;
      do {
        sVar16 = (long)*(int *)((long)&pMVar5->h + lVar13) * (long)iVar12 * _elemsize;
        memcpy(pvVar21,*(void **)((long)&pMVar5->data + lVar13),sVar16);
        pvVar21 = (void *)((long)pvVar21 + sVar16);
        uVar19 = uVar19 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x48;
      } while (uVar19 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  if ((uVar1 == 2) && (iVar15 == 1)) {
    uVar2 = pMVar5->h;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar12 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    if (0 < (int)uVar2) {
      uVar19 = 0;
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pMVar11 = pMVar5;
        if (pMVar7 != pMVar5) {
          pvVar21 = (void *)((long)pMVar4->w * uVar19 * pMVar4->elemsize + (long)pMVar4->data);
          lVar13 = 0x2c;
          uVar17 = 0;
          do {
            lVar9 = (long)*(int *)((long)&pMVar11->data + lVar13);
            memcpy(pvVar21,(void *)(uVar19 * lVar9 * *(long *)((long)pMVar11 + lVar13 + -0x1c) +
                                   *(long *)((long)pMVar11 + lVar13 + -0x2c)),lVar9 * _elemsize);
            pvVar21 = (void *)((long)pvVar21 +
                              (long)*(int *)((long)&pMVar11->data + lVar13) * _elemsize);
            uVar17 = uVar17 + 1;
            pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            lVar13 = lVar13 + 0x48;
          } while (uVar17 < (ulong)(((long)pMVar5 - (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar19 = uVar19 + 1;
        pMVar7 = pMVar5;
        pMVar5 = pMVar11;
      } while (uVar19 != uVar2);
    }
  }
  if ((uVar1 - 3 < 2) && (iVar15 == 0)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar12 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->c;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar5->w,pMVar5->h,pMVar5->d,iVar12,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar4->dims = uVar1;
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      iVar12 = 0;
      lVar13 = 0x40;
      uVar19 = 0;
      do {
        iVar8 = *(int *)((long)pMVar5 + lVar13 + -8);
        memcpy((void *)(pMVar4->cstep * (long)iVar12 * pMVar4->elemsize + (long)pMVar4->data),
               *(void **)((long)pMVar5 + lVar13 + -0x40),
               (long)iVar8 * _elemsize * *(long *)((long)&pMVar5->data + lVar13));
        iVar12 = iVar12 + iVar8;
        uVar19 = uVar19 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x48;
      } while (uVar19 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  if ((iVar15 == 1 && (uVar1 ^ 3) == 0) || ((uVar1 ^ 4) == 0 && iVar15 == 2)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar5->d;
    uVar3 = pMVar5->c;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar12 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->h;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar5->w,iVar12,uVar2,uVar3,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar4->dims = uVar1;
    if (0 < (int)uVar3) {
      uVar19 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar21 = (void *)(pMVar4->cstep * uVar19 * pMVar4->elemsize + (long)pMVar4->data);
          pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          uVar17 = 0;
          do {
            bVar22 = pMVar5 != pMVar7;
            pMVar5 = pMVar7;
            if (bVar22) {
              lVar13 = 0x40;
              uVar20 = 0;
              do {
                lVar10 = (long)*(int *)((long)pMVar7 + lVar13 + -0x14);
                lVar9 = *(long *)((long)pMVar7 + lVar13 + -0x30);
                lVar14 = (long)*(int *)((long)pMVar7 + lVar13 + -0x10);
                sVar16 = lVar14 * lVar10 * _elemsize;
                memcpy(pvVar21,(void *)(lVar9 * lVar14 * uVar17 * lVar10 +
                                       *(long *)((long)&pMVar7->data + lVar13) * uVar19 * lVar9 +
                                       *(long *)((long)pMVar7 + lVar13 + -0x40)),sVar16);
                pvVar21 = (void *)(sVar16 + (long)pvVar21);
                uVar20 = uVar20 + 1;
                pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                lVar13 = lVar13 + 0x48;
              } while (uVar20 < (ulong)(((long)pMVar5 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar2);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar3);
    }
  }
  if (((uVar1 ^ 3) == 0 && iVar15 == 2) || ((uVar1 ^ 4) == 0 && iVar15 == 3)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar5->h;
    uVar3 = pMVar5->d;
    _c = pMVar5->c;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar12 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,uVar3,_c,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar4->dims = uVar1;
    if (0 < (int)_c) {
      uVar19 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar21 = (void *)(pMVar4->cstep * uVar19 * pMVar4->elemsize + (long)pMVar4->data);
          uVar17 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar20 = 0;
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                pMVar11 = pMVar5;
                if (pMVar7 != pMVar5) {
                  lVar13 = 0x40;
                  uVar18 = 0;
                  do {
                    lVar10 = (long)*(int *)((long)pMVar11 + lVar13 + -0x14);
                    lVar9 = *(long *)((long)pMVar11 + lVar13 + -0x30);
                    lVar14 = lVar9 * lVar10;
                    memcpy(pvVar21,(void *)(lVar14 * uVar20 +
                                            (long)*(int *)((long)pMVar11 + lVar13 + -0x10) * uVar17
                                            * lVar14 +
                                           *(long *)((long)&pMVar11->data + lVar13) * uVar19 * lVar9
                                           + *(long *)((long)pMVar11 + lVar13 + -0x40)),
                           lVar10 * _elemsize);
                    pvVar21 = (void *)((long)*(int *)((long)pMVar11 + lVar13 + -0x14) * _elemsize +
                                      (long)pvVar21);
                    uVar18 = uVar18 + 1;
                    pMVar11 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar5 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                    lVar13 = lVar13 + 0x48;
                  } while (uVar18 < (ulong)(((long)pMVar5 - (long)pMVar11 >> 3) *
                                           -0x71c71c71c71c71c7));
                }
                uVar20 = uVar20 + 1;
                pMVar7 = pMVar5;
                pMVar5 = pMVar11;
              } while (uVar20 != uVar2);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar3);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != _c);
    }
  }
  iVar12 = 0;
  if ((uVar1 == 4) && (iVar12 = 0, iVar15 == 1)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar5->c;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar13 == 0) {
      iVar15 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar6 = &pMVar5->d;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar5->w,pMVar5->h,iVar15,uVar1,_elemsize,opt->blob_allocator);
    iVar12 = -100;
    if ((pMVar4->data != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
      if ((int)uVar1 < 1) {
        iVar12 = 0;
      }
      else {
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar19 = 0;
        do {
          bVar22 = pMVar5 != pMVar7;
          pMVar5 = pMVar7;
          if (bVar22) {
            pvVar21 = (void *)(pMVar4->cstep * uVar19 * pMVar4->elemsize + (long)pMVar4->data);
            lVar13 = 0x40;
            uVar17 = 0;
            do {
              sVar16 = (long)*(int *)((long)pMVar7 + lVar13 + -0xc) * _elemsize *
                       (long)*(int *)((long)pMVar7 + lVar13 + -0x10) *
                       (long)*(int *)((long)pMVar7 + lVar13 + -0x14);
              memcpy(pvVar21,(void *)(*(long *)((long)&pMVar7->data + lVar13) * uVar19 *
                                      *(long *)((long)pMVar7 + lVar13 + -0x30) +
                                     *(long *)((long)pMVar7 + lVar13 + -0x40)),sVar16);
              pvVar21 = (void *)((long)pvVar21 + sVar16);
              uVar17 = uVar17 + 1;
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              lVar13 = lVar13 + 0x48;
            } while (uVar17 < (ulong)(((long)pMVar5 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar19 = uVar19 + 1;
          iVar12 = 0;
        } while (uVar19 != uVar1);
      }
    }
  }
  return iVar12;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const unsigned char* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elemsize;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const unsigned char* ptr = bottom_blob.channel(q).depth(i).row<const unsigned char>(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elemsize;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }
    }

    return 0;
}